

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O2

void __thiscall ON_Annotation::ON_Annotation(ON_Annotation *this,ON_Annotation *src)

{
  undefined8 uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  double dVar4;
  ON_UUID *pOVar5;
  long lVar6;
  ON_Plane *pOVar7;
  ON_Plane *pOVar8;
  byte bVar9;
  
  bVar9 = 0;
  ON_Geometry::ON_Geometry(&this->super_ON_Geometry,&src->super_ON_Geometry);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_0081b170;
  this->m_annotation_type = Unset;
  this->m_allow_text_scaling = true;
  this->m_reserved2 = '\0';
  this->m_reserved3 = '\0';
  this->m_reserved4 = 0;
  pOVar5 = ON_ModelComponent::Id(&ON_DimStyle::Default.super_ON_ModelComponent);
  uVar2 = pOVar5->Data2;
  uVar3 = pOVar5->Data3;
  uVar1 = *(undefined8 *)pOVar5->Data4;
  (this->m_dimstyle_id).Data1 = pOVar5->Data1;
  (this->m_dimstyle_id).Data2 = uVar2;
  (this->m_dimstyle_id).Data3 = uVar3;
  *(undefined8 *)(this->m_dimstyle_id).Data4 = uVar1;
  pOVar7 = &ON_Plane::World_xy;
  pOVar8 = &this->m_plane;
  for (lVar6 = 0x10; dVar4 = ON_2dVector::XAxis.y, lVar6 != 0; lVar6 = lVar6 + -1) {
    (pOVar8->origin).x = (pOVar7->origin).x;
    pOVar7 = (ON_Plane *)((long)pOVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    pOVar8 = (ON_Plane *)((long)pOVar8 + (ulong)bVar9 * -0x10 + 8);
  }
  (this->m_horizontal_direction).x = ON_2dVector::XAxis.x;
  (this->m_horizontal_direction).y = dVar4;
  this->m_text = (ON_TextContent *)0x0;
  this->m_override_dimstyle = (ON_DimStyle *)0x0;
  this->m_parent_dimstyle_content_version_number = 0;
  ON_BoundingBoxCache::ON_BoundingBoxCache(&this->m_bbox_cache);
  Internal_CopyFrom(this,src);
  return;
}

Assistant:

ON_Annotation::ON_Annotation(const ON_Annotation& src)
  : ON_Geometry(src)
{
  Internal_CopyFrom(src);
}